

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O1

StringPtr capnp::operator*(long param_1)

{
  ArrayPtr<const_char> AVar1;
  PointerReader local_20;
  
  if (*(short *)(param_1 + 0x34) == 0) {
    local_20.nestingLimit = 0x7fffffff;
    local_20.capTable = (CapTableReader *)0x0;
    local_20.pointer = (WirePointer *)0x0;
    local_20.segment = (SegmentReader *)0x0;
  }
  else {
    local_20.nestingLimit = *(int *)(param_1 + 0x38);
    local_20.pointer = *(WirePointer **)(param_1 + 0x28);
    local_20.segment = *(SegmentReader **)(param_1 + 0x10);
    local_20.capTable = *(CapTableReader **)(param_1 + 0x18);
  }
  AVar1 = (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_20,(void *)0x0,0);
  return (StringPtr)AVar1;
}

Assistant:

inline PointerReader StructReader::getPointerField(StructPointerOffset ptrIndex) const {
  if (ptrIndex < pointerCount) {
    // Hacky because WirePointer is defined in the .c++ file (so is incomplete here).
    return PointerReader(segment, capTable, reinterpret_cast<const WirePointer*>(
        reinterpret_cast<const word*>(pointers) + ptrIndex * WORDS_PER_POINTER), nestingLimit);
  } else{
    return PointerReader();
  }
}